

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumValueDescriptorProto::~EnumValueDescriptorProto
          (EnumValueDescriptorProto *this)

{
  string *psVar1;
  pointer pcVar2;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__EnumValueDescriptorProto_00630a30;
  psVar1 = (this->name_).ptr_;
  if (psVar1 != (string *)0x0 &&
      psVar1 != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &psVar1->field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(psVar1);
  }
  if ((this != (EnumValueDescriptorProto *)_EnumValueDescriptorProto_default_instance_) &&
     (this->options_ != (EnumValueOptions *)0x0)) {
    (*(this->options_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  internal::
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  ::~InternalMetadataWithArenaBase
            (&(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
            );
  return;
}

Assistant:

EnumValueDescriptorProto::~EnumValueDescriptorProto() {
  // @@protoc_insertion_point(destructor:google.protobuf.EnumValueDescriptorProto)
  SharedDtor();
}